

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReichMooreScatteringRadiusUncertainties.test.cpp
# Opt level: O2

void verifyChunk(ReichMooreScatteringRadiusUncertainties *chunk)

{
  long lVar1;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef macroName_03;
  StringRef macroName_04;
  StringRef macroName_05;
  StringRef macroName_06;
  StringRef macroName_07;
  StringRef macroName_08;
  StringRef macroName_09;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef capturedExpression_03;
  StringRef capturedExpression_04;
  StringRef capturedExpression_05;
  StringRef capturedExpression_06;
  StringRef capturedExpression_07;
  StringRef capturedExpression_08;
  StringRef capturedExpression_09;
  double local_d8;
  undefined1 local_d0 [8];
  undefined8 local_c8;
  char *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8 [2];
  AssertionHandler catchAssertionHandler;
  ITransientExpression local_50;
  double *local_40;
  WithinRelMatcher *local_38;
  
  local_d0 = (undefined1  [8])0x179464;
  local_c8 = (pointer)0x53;
  macroName.m_size = 10;
  macroName.m_start = "CHECK_THAT";
  capturedExpression.m_size = 0x1c;
  capturedExpression.m_start = "1., WithinRel( chunk.DAP() )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName,(SourceLineInfo *)local_d0,capturedExpression,
             ContinueOnFailure);
  local_d8 = 1.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d0,
             *(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d0,&local_d8);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c2370;
  local_40 = &local_d8;
  local_38 = (WithinRelMatcher *)local_d0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d0 = (undefined1  [8])0x179464;
  local_c8 = (pointer)0x54;
  macroName_00.m_size = 10;
  macroName_00.m_start = "CHECK_THAT";
  capturedExpression_00.m_size = 0x2b;
  capturedExpression_00.m_start = "1., WithinRel( chunk.defaultUncertainty() )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_00,(SourceLineInfo *)local_d0,capturedExpression_00,
             ContinueOnFailure);
  local_d8 = 1.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d0,
             *(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d0,&local_d8);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c2370;
  local_40 = &local_d8;
  local_38 = (WithinRelMatcher *)local_d0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d0 = (undefined1  [8])0x179464;
  local_c8 = (pointer)0x56;
  macroName_01.m_size = 5;
  macroName_01.m_start = "CHECK";
  capturedExpression_01.m_size = 0x18;
  capturedExpression_01.m_start = "3 == chunk.DAPL().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_01,(SourceLineInfo *)local_d0,capturedExpression_01,
             ContinueOnFailure);
  lVar1 = (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish +
          (-8 - (long)(chunk->super_ListRecord).data.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
  local_b8[0]._8_8_ = lVar1 >> 3;
  local_c8._1_1_ = lVar1 == 0x18;
  local_c8._0_1_ = true;
  local_d0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c23b0;
  local_c8._4_4_ = 3;
  local_c0 = "==";
  local_b8[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d0 = (undefined1  [8])0x179464;
  local_c8 = (pointer)0x57;
  macroName_02.m_size = 5;
  macroName_02.m_start = "CHECK";
  capturedExpression_02.m_size = 0x21;
  capturedExpression_02.m_start = "3 == chunk.uncertainties().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_02,(SourceLineInfo *)local_d0,capturedExpression_02,
             ContinueOnFailure);
  lVar1 = (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish +
          (-8 - (long)(chunk->super_ListRecord).data.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
  local_b8[0]._8_8_ = lVar1 >> 3;
  local_c8._1_1_ = lVar1 == 0x18;
  local_c8._0_1_ = true;
  local_d0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c23b0;
  local_c8._4_4_ = 3;
  local_c0 = "==";
  local_b8[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d0 = (undefined1  [8])0x179464;
  local_c8 = (pointer)0x59;
  macroName_03.m_size = 10;
  macroName_03.m_start = "CHECK_THAT";
  capturedExpression_03.m_size = 0x20;
  capturedExpression_03.m_start = "2., WithinRel( chunk.DAPL()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_03,(SourceLineInfo *)local_d0,capturedExpression_03,
             ContinueOnFailure);
  local_d8 = 2.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d0,
             (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[1]);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d0,&local_d8);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c2370;
  local_40 = &local_d8;
  local_38 = (WithinRelMatcher *)local_d0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d0 = (undefined1  [8])0x179464;
  local_c8 = (pointer)0x5a;
  macroName_04.m_size = 10;
  macroName_04.m_start = "CHECK_THAT";
  capturedExpression_04.m_size = 0x20;
  capturedExpression_04.m_start = "3., WithinRel( chunk.DAPL()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_04,(SourceLineInfo *)local_d0,capturedExpression_04,
             ContinueOnFailure);
  local_d8 = 3.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d0,
             (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[2]);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d0,&local_d8);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c2370;
  local_40 = &local_d8;
  local_38 = (WithinRelMatcher *)local_d0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d0 = (undefined1  [8])0x179464;
  local_c8 = (pointer)0x5b;
  macroName_05.m_size = 10;
  macroName_05.m_start = "CHECK_THAT";
  capturedExpression_05.m_size = 0x20;
  capturedExpression_05.m_start = "4., WithinRel( chunk.DAPL()[2] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_05,(SourceLineInfo *)local_d0,capturedExpression_05,
             ContinueOnFailure);
  local_d8 = 4.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d0,
             (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[3]);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d0,&local_d8);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c2370;
  local_40 = &local_d8;
  local_38 = (WithinRelMatcher *)local_d0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d0 = (undefined1  [8])0x179464;
  local_c8 = (pointer)0x5c;
  macroName_06.m_size = 10;
  macroName_06.m_start = "CHECK_THAT";
  capturedExpression_06.m_size = 0x29;
  capturedExpression_06.m_start = "2., WithinRel( chunk.uncertainties()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_06,(SourceLineInfo *)local_d0,capturedExpression_06,
             ContinueOnFailure);
  local_d8 = 2.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d0,
             (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[1]);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d0,&local_d8);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c2370;
  local_40 = &local_d8;
  local_38 = (WithinRelMatcher *)local_d0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d0 = (undefined1  [8])0x179464;
  local_c8 = (pointer)0x5d;
  macroName_07.m_size = 10;
  macroName_07.m_start = "CHECK_THAT";
  capturedExpression_07.m_size = 0x29;
  capturedExpression_07.m_start = "3., WithinRel( chunk.uncertainties()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_07,(SourceLineInfo *)local_d0,capturedExpression_07,
             ContinueOnFailure);
  local_d8 = 3.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d0,
             (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[2]);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d0,&local_d8);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c2370;
  local_40 = &local_d8;
  local_38 = (WithinRelMatcher *)local_d0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d0 = (undefined1  [8])0x179464;
  local_c8 = (pointer)0x5e;
  macroName_08.m_size = 10;
  macroName_08.m_start = "CHECK_THAT";
  capturedExpression_08.m_size = 0x29;
  capturedExpression_08.m_start = "4., WithinRel( chunk.uncertainties()[2] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_08,(SourceLineInfo *)local_d0,capturedExpression_08,
             ContinueOnFailure);
  local_d8 = 4.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d0,
             (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[3]);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d0,&local_d8);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c2370;
  local_40 = &local_d8;
  local_38 = (WithinRelMatcher *)local_d0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d0 = (undefined1  [8])0x179464;
  local_c8 = (pointer)0x60;
  macroName_09.m_size = 5;
  macroName_09.m_start = "CHECK";
  capturedExpression_09.m_size = 0xf;
  capturedExpression_09.m_start = "2 == chunk.NC()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_09,(SourceLineInfo *)local_d0,capturedExpression_09,
             ContinueOnFailure);
  local_b8[0]._8_8_ =
       (((long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start >> 3) + 5) / 6 + 1;
  local_c8._1_1_ = local_b8[0]._8_8_ == 2;
  local_c8._0_1_ = true;
  local_d0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c23f0;
  local_c8._4_4_ = 2;
  local_c0 = "==";
  local_b8[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  return;
}

Assistant:

void verifyChunk( const ReichMooreScatteringRadiusUncertainties& chunk ) {

  CHECK_THAT( 1., WithinRel( chunk.DAP() ) );
  CHECK_THAT( 1., WithinRel( chunk.defaultUncertainty() ) );

  CHECK( 3 == chunk.DAPL().size() );
  CHECK( 3 == chunk.uncertainties().size() );

  CHECK_THAT( 2., WithinRel( chunk.DAPL()[0] ) );
  CHECK_THAT( 3., WithinRel( chunk.DAPL()[1] ) );
  CHECK_THAT( 4., WithinRel( chunk.DAPL()[2] ) );
  CHECK_THAT( 2., WithinRel( chunk.uncertainties()[0] ) );
  CHECK_THAT( 3., WithinRel( chunk.uncertainties()[1] ) );
  CHECK_THAT( 4., WithinRel( chunk.uncertainties()[2] ) );

  CHECK( 2 == chunk.NC() );
}